

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O3

void __thiscall draco::PointCloudDecoder::PointCloudDecoder(PointCloudDecoder *this)

{
  this->_vptr_PointCloudDecoder = (_func_int **)&PTR__PointCloudDecoder_001dc278;
  this->options_ = (DecoderOptions *)0x0;
  this->point_cloud_ = (PointCloud *)0x0;
  (this->attributes_decoders_).
  super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attributes_decoders_).
  super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->attributes_decoders_).
  super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->buffer_ = (DecoderBuffer *)0x0;
  this->version_major_ = '\0';
  this->version_minor_ = '\0';
  return;
}

Assistant:

PointCloudDecoder::PointCloudDecoder()
    : point_cloud_(nullptr),
      buffer_(nullptr),
      version_major_(0),
      version_minor_(0),
      options_(nullptr) {}